

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t42drivr.c
# Opt level: O3

FT_UInt t42_get_name_index(T42_Face face,FT_String *glyph_name)

{
  char cVar1;
  FT_String **ppFVar2;
  char *__s2;
  int iVar3;
  long lVar4;
  long lVar5;
  
  lVar5 = (long)(face->type1).num_glyphs;
  if (0 < lVar5) {
    ppFVar2 = (face->type1).glyph_names;
    cVar1 = *glyph_name;
    lVar4 = 0;
    do {
      __s2 = ppFVar2[lVar4];
      if ((cVar1 == *__s2) && (iVar3 = strcmp(glyph_name,__s2), iVar3 == 0)) {
        lVar5 = strtol((char *)(face->type1).charstrings[lVar4],(char **)0x0,10);
        return (FT_UInt)lVar5;
      }
      lVar4 = lVar4 + 1;
    } while (lVar5 != lVar4);
  }
  return 0;
}

Assistant:

static FT_UInt
  t42_get_name_index( T42_Face    face,
                      FT_String*  glyph_name )
  {
    FT_Int  i;


    for ( i = 0; i < face->type1.num_glyphs; i++ )
    {
      FT_String*  gname = face->type1.glyph_names[i];


      if ( glyph_name[0] == gname[0] && !ft_strcmp( glyph_name, gname ) )
        return (FT_UInt)ft_strtol( (const char *)face->type1.charstrings[i],
                                   NULL, 10 );
    }

    return 0;
  }